

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O2

int32_t uprv_stableBinarySearch_63
                  (char *array,int32_t limit,void *item,int32_t itemSize,UComparator *cmp,
                  void *context)

{
  bool bVar1;
  uint uVar2;
  int32_t iVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  
  bVar1 = false;
  uVar5 = 0;
  while (uVar7 = limit, 8 < (int)(uVar7 - uVar5)) {
    uVar2 = (int)(uVar7 + uVar5) / 2;
    iVar3 = (*cmp)(context,item,array + (int)(uVar2 * itemSize));
    if (-1 < iVar3) {
      uVar5 = uVar2;
    }
    limit = uVar2;
    if (-1 < iVar3) {
      limit = uVar7;
    }
    if (iVar3 == 0) {
      bVar1 = true;
      limit = uVar7;
      uVar5 = uVar2 + 1;
    }
  }
  lVar4 = (long)(int)uVar5;
  uVar2 = uVar7;
  if ((int)uVar7 <= (int)uVar5) {
    uVar2 = uVar5;
  }
  pcVar6 = array + itemSize * lVar4;
  for (; uVar8 = uVar2, lVar4 < (int)uVar7; lVar4 = lVar4 + 1) {
    iVar3 = (*cmp)(context,item,pcVar6);
    if (iVar3 == 0) {
      bVar1 = true;
    }
    else {
      uVar8 = uVar5;
      if (iVar3 < 0) break;
    }
    uVar5 = uVar5 + 1;
    pcVar6 = pcVar6 + itemSize;
  }
  uVar5 = ~uVar8;
  if (bVar1) {
    uVar5 = uVar8 - 1;
  }
  return uVar5;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_stableBinarySearch(char *array, int32_t limit, void *item, int32_t itemSize,
                        UComparator *cmp, const void *context) {
    int32_t start=0;
    UBool found=FALSE;

    /* Binary search until we get down to a tiny sub-array. */
    while((limit-start)>=MIN_QSORT) {
        int32_t i=(start+limit)/2;
        int32_t diff=cmp(context, item, array+i*itemSize);
        if(diff==0) {
            /*
             * Found the item. We look for the *last* occurrence of such
             * an item, for stable sorting.
             * If we knew that there will be only few equal items,
             * we could break now and enter the linear search.
             * However, if there are many equal items, then it should be
             * faster to continue with the binary search.
             * It seems likely that we either have all unique items
             * (where found will never become TRUE in the insertion sort)
             * or potentially many duplicates.
             */
            found=TRUE;
            start=i+1;
        } else if(diff<0) {
            limit=i;
        } else {
            start=i;
        }
    }

    /* Linear search over the remaining tiny sub-array. */
    while(start<limit) {
        int32_t diff=cmp(context, item, array+start*itemSize);
        if(diff==0) {
            found=TRUE;
        } else if(diff<0) {
            break;
        }
        ++start;
    }
    return found ? (start-1) : ~start;
}